

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UInt32_decodeBinary(UA_UInt32 *dst,UA_DataType *_)

{
  UA_DataType *__local;
  UA_UInt32 *dst_local;
  
  if (end < pos + 4) {
    dst_local._4_4_ = 0x80070000;
  }
  else {
    *dst = *(UA_UInt32 *)pos;
    pos = pos + 4;
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

static UA_StatusCode
UInt32_decodeBinary(UA_UInt32 *dst, const UA_DataType *_) {
    if(pos + sizeof(UA_UInt32) > end)
        return UA_STATUSCODE_BADDECODINGERROR;
#if UA_BINARY_OVERLAYABLE_INTEGER
    memcpy(dst, pos, sizeof(UA_UInt32));
#else
    UA_decode32(pos, dst);
#endif
    pos += 4;
    return UA_STATUSCODE_GOOD;
}